

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_iq3_xxs_impl(int grid_size,float *x,void *vy,int64_t n,float *quant_weights)

{
  int iVar1;
  uint32_t *grid;
  int *piVar2;
  uint16_t *puVar3;
  ggml_fp16_t gVar4;
  int i;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  int i_1;
  long lVar14;
  int8_t *piVar15;
  undefined8 *__dest;
  undefined4 in_register_0000003c;
  long lVar16;
  byte bVar17;
  int iVar18;
  byte bVar19;
  int i_5;
  ulong uVar20;
  char *pcVar21;
  int i_3;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint8_t block_signs [8];
  long local_338;
  long local_330;
  float local_308;
  long local_2e8;
  long local_2c0;
  _Bool is_on_grid_aux [8];
  _Bool is_on_grid [8];
  int8_t L [32];
  int8_t Laux [32];
  uint8_t q3 [104];
  float scales [8];
  float xval [32];
  float weight [32];
  float waux [32];
  
  puVar3 = iq3_data[0].neighbours;
  piVar2 = iq3_data[0].map;
  grid = iq3_data[0].grid;
  if (iq3_data[0].grid == (uint32_t *)0x0) {
    pcVar21 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar18 = 0xde6;
  }
  else if (iq3_data[0].map == (int *)0x0) {
    pcVar21 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar18 = 0xde7;
  }
  else if (iq3_data[0].neighbours == (uint16_t *)0x0) {
    pcVar21 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar18 = 0xde8;
  }
  else {
    if ((char)vy == '\0') {
      __dest = (undefined8 *)((long)x + 2);
      uVar12 = (long)vy >> 8;
      if ((long)vy >> 8 < 1) {
        uVar12 = 0;
      }
      uVar8 = 0;
      local_330 = CONCAT44(in_register_0000003c,grid_size);
      local_2e8 = n;
      do {
        if (uVar8 == uVar12) {
          return;
        }
        *(ggml_fp16_t *)x = 0;
        q3[0x50] = '\0';
        q3[0x51] = '\0';
        q3[0x52] = '\0';
        q3[0x53] = '\0';
        q3[0x54] = '\0';
        q3[0x55] = '\0';
        q3[0x56] = '\0';
        q3[0x57] = '\0';
        q3[0x58] = '\0';
        q3[0x59] = '\0';
        q3[0x5a] = '\0';
        q3[0x5b] = '\0';
        q3[0x5c] = '\0';
        q3[0x5d] = '\0';
        q3[0x5e] = '\0';
        q3[0x5f] = '\0';
        q3[0x40] = '\0';
        q3[0x41] = '\0';
        q3[0x42] = '\0';
        q3[0x43] = '\0';
        q3[0x44] = '\0';
        q3[0x45] = '\0';
        q3[0x46] = '\0';
        q3[0x47] = '\0';
        q3[0x48] = '\0';
        q3[0x49] = '\0';
        q3[0x4a] = '\0';
        q3[0x4b] = '\0';
        q3[0x4c] = '\0';
        q3[0x4d] = '\0';
        q3[0x4e] = '\0';
        q3[0x4f] = '\0';
        q3[0x30] = '\0';
        q3[0x31] = '\0';
        q3[0x32] = '\0';
        q3[0x33] = '\0';
        q3[0x34] = '\0';
        q3[0x35] = '\0';
        q3[0x36] = '\0';
        q3[0x37] = '\0';
        q3[0x38] = '\0';
        q3[0x39] = '\0';
        q3[0x3a] = '\0';
        q3[0x3b] = '\0';
        q3[0x3c] = '\0';
        q3[0x3d] = '\0';
        q3[0x3e] = '\0';
        q3[0x3f] = '\0';
        q3[0x20] = '\0';
        q3[0x21] = '\0';
        q3[0x22] = '\0';
        q3[0x23] = '\0';
        q3[0x24] = '\0';
        q3[0x25] = '\0';
        q3[0x26] = '\0';
        q3[0x27] = '\0';
        q3[0x28] = '\0';
        q3[0x29] = '\0';
        q3[0x2a] = '\0';
        q3[0x2b] = '\0';
        q3[0x2c] = '\0';
        q3[0x2d] = '\0';
        q3[0x2e] = '\0';
        q3[0x2f] = '\0';
        q3[0x10] = '\0';
        q3[0x11] = '\0';
        q3[0x12] = '\0';
        q3[0x13] = '\0';
        q3[0x14] = '\0';
        q3[0x15] = '\0';
        q3[0x16] = '\0';
        q3[0x17] = '\0';
        q3[0x18] = '\0';
        q3[0x19] = '\0';
        q3[0x1a] = '\0';
        q3[0x1b] = '\0';
        q3[0x1c] = '\0';
        q3[0x1d] = '\0';
        q3[0x1e] = '\0';
        q3[0x1f] = '\0';
        q3[0] = '\0';
        q3[1] = '\0';
        q3[2] = '\0';
        q3[3] = '\0';
        q3[4] = '\0';
        q3[5] = '\0';
        q3[6] = '\0';
        q3[7] = '\0';
        q3[8] = '\0';
        q3[9] = '\0';
        q3[10] = '\0';
        q3[0xb] = '\0';
        q3[0xc] = '\0';
        q3[0xd] = '\0';
        q3[0xe] = '\0';
        q3[0xf] = '\0';
        q3[0x60] = '\0';
        q3[0x61] = '\0';
        q3[0x62] = '\0';
        q3[99] = '\0';
        q3[100] = '\0';
        q3[0x65] = '\0';
        q3[0x66] = '\0';
        q3[0x67] = '\0';
        fVar27 = 0.0;
        for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
          fVar23 = *(float *)(local_330 + lVar5 * 4);
          fVar27 = fVar27 + fVar23 * fVar23;
        }
        fVar23 = 0.0;
        local_2c0 = local_2e8;
        local_338 = local_330;
        for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
          if (n == 0) {
            for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
              fVar25 = *(float *)(local_338 + lVar14 * 4);
              weight[lVar14] = fVar25 * fVar25;
            }
          }
          else {
            for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
              fVar25 = *(float *)(local_2c0 + lVar14 * 4);
              fVar24 = *(float *)(local_338 + lVar14 * 4);
              fVar24 = fVar24 * fVar24 + (fVar27 + fVar27) * 0.00390625;
              if (fVar24 < 0.0) {
                fVar24 = sqrtf(fVar24);
              }
              else {
                fVar24 = SQRT(fVar24);
              }
              weight[lVar14] = fVar25 * fVar24;
            }
          }
          for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
            fVar25 = weight[lVar14];
            if (fVar25 < 0.0) {
              fVar25 = sqrtf(fVar25);
            }
            else {
              fVar25 = SQRT(fVar25);
            }
            waux[lVar14] = fVar25;
          }
          pfVar6 = weight;
          pfVar7 = xval;
          lVar14 = local_338;
          for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
            bVar17 = 0;
            bVar19 = 0;
            for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
              fVar25 = *(float *)(lVar14 + lVar9 * 4);
              bVar22 = fVar25 < -fVar25;
              fVar24 = -fVar25;
              if (!bVar22) {
                fVar24 = fVar25;
              }
              uVar20 = (ulong)(uint)(1 << ((byte)lVar9 & 0x1f));
              if (!bVar22) {
                uVar20 = 0;
              }
              bVar19 = bVar19 + bVar22;
              bVar17 = bVar17 | (byte)uVar20;
              pfVar7[lVar9] = fVar24;
            }
            if ((bool)(bVar19 & 1)) {
              fVar25 = *(float *)(lVar5 * 0x80 +
                                  uVar8 * 0x400 + CONCAT44(in_register_0000003c,grid_size) +
                                 lVar16 * 0x20);
              fVar25 = weight[lVar16 * 8] * fVar25 * fVar25;
              uVar10 = 0;
              for (uVar20 = 1; uVar20 != 8; uVar20 = uVar20 + 1) {
                fVar24 = *(float *)(lVar14 + uVar20 * 4);
                fVar24 = pfVar6[uVar20] * fVar24 * fVar24;
                if (fVar24 < fVar25) {
                  uVar10 = uVar20 & 0xffffffff;
                  fVar25 = fVar24;
                }
              }
              iVar18 = (int)lVar16 * 8 + (int)uVar10;
              xval[iVar18] = -xval[iVar18];
              bVar17 = bVar17 ^ (byte)(1 << ((byte)uVar10 & 0x1f));
            }
            block_signs[lVar16] = bVar17 & 0x7f;
            pfVar7 = pfVar7 + 8;
            lVar14 = lVar14 + 0x20;
            pfVar6 = pfVar6 + 8;
          }
          fVar25 = xval[0];
          for (lVar14 = 1; lVar14 != 0x20; lVar14 = lVar14 + 1) {
            if (fVar25 <= xval[lVar14]) {
              fVar25 = xval[lVar14];
            }
          }
          if (1e-08 <= fVar25) {
            local_308 = fVar25 / 15.0;
            fVar24 = 0.0;
            for (iVar18 = -0xf; iVar18 != 0x10; iVar18 = iVar18 + 1) {
              fVar28 = ((float)iVar18 * 0.2 + 15.0) / fVar25;
              pfVar6 = xval;
              pcVar21 = Laux;
              for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
                for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                  uVar11 = (uint)((pfVar6[lVar16] * fVar28 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                  if (0x400006 < uVar11) {
                    uVar11 = 0x400007;
                  }
                  if (uVar11 < 0x400001) {
                    uVar11 = 0;
                  }
                  pcVar21[lVar16] = (char)uVar11;
                }
                uVar20 = 0;
                pcVar13 = pcVar21;
                for (lVar16 = 0; lVar16 != 0xc; lVar16 = lVar16 + 3) {
                  uVar20 = (ulong)((uint)uVar20 | (int)*pcVar13 << ((byte)lVar16 & 0x1f));
                  pcVar13 = pcVar13 + 1;
                }
                iVar1 = piVar2[uVar20 & 0xffff];
                is_on_grid_aux[lVar14] = true;
                if ((long)iVar1 < 0) {
                  is_on_grid_aux[lVar14] = false;
                  iq3_find_best_neighbour
                            (puVar3 + (-1 - (long)iVar1),grid,xval + lVar14 * 4,waux + lVar14 * 4,
                             1.0 / fVar28,Laux + lVar14 * 4);
                }
                pcVar21 = pcVar21 + 4;
                pfVar6 = pfVar6 + 4;
              }
              fVar28 = 0.0;
              fVar26 = 0.0;
              for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
                fVar29 = (float)(Laux[lVar14] * 2 + 1);
                fVar28 = fVar28 + fVar29 * fVar29 * weight[lVar14];
                fVar26 = fVar26 + fVar29 * xval[lVar14] * weight[lVar14];
              }
              if ((0.0 < fVar28) && (fVar24 * fVar28 < fVar26 * fVar26)) {
                local_308 = fVar26 / fVar28;
                for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
                  L[lVar14] = Laux[lVar14];
                }
                for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
                  is_on_grid[lVar14] = is_on_grid_aux[lVar14];
                }
                fVar24 = fVar26 * local_308;
              }
            }
            iVar18 = 0;
            for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
              iVar18 = iVar18 + (is_on_grid[lVar14] ^ 1);
            }
            if ((iVar18 != 0) && (0.0 < local_308)) {
              piVar15 = L;
              pfVar6 = xval;
              for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
                if (is_on_grid[lVar14] == false) {
                  uVar20 = 0;
                  pfVar7 = pfVar6;
                  for (lVar16 = 0; lVar16 != 0xc; lVar16 = lVar16 + 3) {
                    uVar11 = (uint)((*pfVar7 * (1.0 / local_308) + -1.0) * 0.5 + 12582912.0) &
                             0x7fffff;
                    if (0x400006 < uVar11) {
                      uVar11 = 0x400007;
                    }
                    if (uVar11 < 0x400001) {
                      uVar11 = 0x400000;
                    }
                    uVar20 = (ulong)((uint)uVar20 | uVar11 << ((byte)lVar16 & 0x1f));
                    pfVar7 = pfVar7 + 1;
                  }
                  uVar11 = piVar2[uVar20 & 0xffff];
                  if ((long)(int)uVar11 < 0) {
                    uVar11 = iq3_find_best_neighbour
                                       (puVar3 + (-1 - (long)(int)uVar11),grid,xval + lVar14 * 4,
                                        waux + lVar14 * 4,local_308,L + lVar14 * 4);
                  }
                  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                    piVar15[lVar16] =
                         (int8_t)((int)(short)(*(char *)((long)grid + lVar16 + (ulong)uVar11 * 4) +
                                              -1) / 2);
                  }
                }
                pfVar6 = pfVar6 + 4;
                piVar15 = piVar15 + 4;
              }
              fVar25 = 0.0;
              fVar24 = 0.0;
              for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
                fVar28 = (float)(L[lVar14] * 2 + 1);
                fVar25 = fVar25 + fVar28 * xval[lVar14] * weight[lVar14];
                fVar24 = fVar24 + fVar28 * fVar28 * weight[lVar14];
              }
              local_308 = (float)(~-(uint)(0.0 < fVar24) & (uint)local_308 |
                                 (uint)(fVar25 / fVar24) & -(uint)(0.0 < fVar24));
            }
            if (local_308 < 0.0) {
              for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                block_signs[lVar14] = ~block_signs[lVar14] & 0x7f;
              }
              local_308 = -local_308;
            }
            pcVar21 = L;
            for (uVar20 = 0; uVar20 != 8; uVar20 = uVar20 + 1) {
              uVar10 = 0;
              pcVar13 = pcVar21;
              for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 3) {
                uVar10 = (ulong)((uint)uVar10 | (int)*pcVar13 << ((byte)lVar14 & 0x1f));
                pcVar13 = pcVar13 + 1;
              }
              if (piVar2[uVar10 & 0xffff] < 0) {
                printf("Oops: found point %u not on grid:");
                lVar5 = 4;
                while (bVar22 = lVar5 != 0, lVar5 = lVar5 + -1, bVar22) {
                  printf(" %d",(ulong)(uint)(int)*pcVar21);
                  pcVar21 = pcVar21 + 1;
                }
                putchar(10);
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                           ,0xe8a,"fatal error");
              }
              q3[uVar20 | lVar5 * 8] = (uint8_t)piVar2[uVar10 & 0xffff];
              pcVar21 = pcVar21 + 4;
            }
            *(uint *)(q3 + lVar5 * 4 + 0x40) =
                 (uint)block_signs[3] << 0x15 | (uint)block_signs[2] << 0xe |
                 (uint)block_signs[1] << 7 | (uint)block_signs[0];
            if (local_308 < 0.0) {
              pcVar21 = "scale >= 0";
              iVar18 = 0xe95;
              goto LAB_001396ab;
            }
            scales[lVar5] = local_308;
            if (fVar23 <= local_308) {
              fVar23 = local_308;
            }
          }
          else {
            scales[lVar5] = 0.0;
            L[0] = '\0';
            L[1] = '\0';
            L[2] = '\0';
            L[3] = '\0';
            L[4] = '\0';
            L[5] = '\0';
            L[6] = '\0';
            L[7] = '\0';
            L[8] = '\0';
            L[9] = '\0';
            L[10] = '\0';
            L[0xb] = '\0';
            L[0xc] = '\0';
            L[0xd] = '\0';
            L[0xe] = '\0';
            L[0xf] = '\0';
            L[0x10] = '\0';
            L[0x11] = '\0';
            L[0x12] = '\0';
            L[0x13] = '\0';
            L[0x14] = '\0';
            L[0x15] = '\0';
            L[0x16] = '\0';
            L[0x17] = '\0';
            L[0x18] = '\0';
            L[0x19] = '\0';
            L[0x1a] = '\0';
            L[0x1b] = '\0';
            L[0x1c] = '\0';
            L[0x1d] = '\0';
            L[0x1e] = '\0';
            L[0x1f] = '\0';
          }
          local_338 = local_338 + 0x80;
          local_2c0 = local_2c0 + 0x80;
        }
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          gVar4 = ggml_compute_fp32_to_fp16((fVar23 / 31.0) * 1.0125);
          *(ggml_fp16_t *)x = gVar4;
          for (lVar5 = 0x10; lVar5 != 0x18; lVar5 = lVar5 + 1) {
            uVar11 = (uint)((*(float *)(q3 + lVar5 * 4 + 0x30) * (1.0 / (fVar23 / 31.0)) + -1.0) *
                            0.5 + 12582912.0) & 0x7fffff;
            if (0x40000e < uVar11) {
              uVar11 = 0x40000f;
            }
            if (uVar11 < 0x400001) {
              uVar11 = 0;
            }
            *(uint *)(q3 + lVar5 * 4) = *(uint *)(q3 + lVar5 * 4) | uVar11 << 0x1c;
          }
          memcpy(__dest,q3,0x60);
        }
        else {
          __dest[10] = 0;
          __dest[0xb] = 0;
          __dest[8] = 0;
          __dest[9] = 0;
          __dest[6] = 0;
          __dest[7] = 0;
          __dest[4] = 0;
          __dest[5] = 0;
          __dest[2] = 0;
          __dest[3] = 0;
          *__dest = 0;
          __dest[1] = 0;
        }
        x = (float *)((long)x + 0x62);
        __dest = (undefined8 *)((long)__dest + 0x62);
        uVar8 = uVar8 + 1;
        local_330 = local_330 + 0x400;
        local_2e8 = local_2e8 + 0x400;
      } while( true );
    }
    pcVar21 = "n%QK_K == 0";
    iVar18 = 0xde9;
  }
LAB_001396ab:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar18,"GGML_ASSERT(%s) failed",pcVar21);
}

Assistant:

static void quantize_row_iq3_xxs_impl(int grid_size, const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t n,
        const float * GGML_RESTRICT quant_weights) {

    const int gindex = iq3_data_index(grid_size);

    const uint32_t * kgrid_q3xs      = iq3_data[gindex].grid;
    const int      * kmap_q3xs       = iq3_data[gindex].map;
    const uint16_t * kneighbors_q3xs = iq3_data[gindex].neighbours;

    //GGML_ASSERT(quant_weights   && "missing quantization weights");
    GGML_ASSERT(kgrid_q3xs      && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kmap_q3xs       && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kneighbors_q3xs && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(n%QK_K == 0);

    const int kMaxQ = 8;

    const int64_t nbl = n/QK_K;

    ggml_fp16_t * dh;
    uint8_t * qs;
    int block_size;
    if (grid_size == 256) {
        block_iq3_xxs * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_xxs);
    } else {
        block_iq3_s * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_s);
    }
    int quant_size = block_size - sizeof(ggml_fp16_t);

    float scales[QK_K/32];
    float weight[32];
    float xval[32];
    int8_t L[32];
    int8_t Laux[32];
    float  waux[32];
    bool   is_on_grid[8];
    bool   is_on_grid_aux[8];
    uint8_t block_signs[8];
    uint8_t q3[3*(QK_K/8)+QK_K/32];
    uint32_t * scales_and_signs = (uint32_t *)(q3 + QK_K/4);
    uint8_t  * qh = q3 + 3*(QK_K/8);

    for (int ibl = 0; ibl < nbl; ++ibl) {

        dh[0] = GGML_FP32_TO_FP16(0.f);
        memset(q3, 0, 3*QK_K/8+QK_K/32);

        float max_scale = 0;

        const float * xbl = x + QK_K*ibl;
        float sumx2 = 0;
        for (int i = 0; i < QK_K; ++i) sumx2 += xbl[i]*xbl[i];
        float sigma2 = 2*sumx2/QK_K;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float * xb = xbl + 32*ib;
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*ibl + 32*ib;
                for (int i = 0; i < 32; ++i) weight[i] = qw[i] * sqrtf(sigma2 + xb[i]*xb[i]);
            } else {
                for (int i = 0; i < 32; ++i) weight[i] = xb[i]*xb[i];
            }
            for (int i = 0; i < 32; ++i) waux[i] = sqrtf(weight[i]);
            for (int k = 0; k < 4; ++k) {
                int nflip = 0;
                uint8_t s = 0;
                for (int i = 0; i < 8; ++i) {
                    if (xb[8*k + i] >= 0) xval[8*k + i] = xb[8*k + i];
                    else {
                        xval[8*k + i] = -xb[8*k + i]; ++nflip; s |= (1 << i);
                    }
                }
                if (nflip%2) {
                    int imin = 0; float min = weight[8*k+imin]*xb[8*k+imin]*xb[8*k+imin];
                    for (int i = 1; i < 8; ++i) {
                        float ax = weight[8*k+i]*xb[8*k+i]*xb[8*k+i];
                        if (ax < min) {
                            min = ax; imin = i;
                        }
                    }
                    xval[8*k+imin] = -xval[8*k+imin];
                    s ^= (1 << imin);
                }
                block_signs[k] = s & 127;
            }
            float max = xval[0];
            for (int i = 1; i < 32; ++i) max = MAX(max, xval[i]);
            if (max < GROUP_MAX_EPS_IQ3_XXS) {
                scales[ib] = 0;
                memset(L, 0, 32);
                continue;
            }
            float best = 0;
            float scale = max/(2*kMaxQ-1);
            for (int is = -15; is <= 15; ++is) {
                float id = (2*kMaxQ-1+is*0.2f)/max;
                float this_scale = 1/id;
                for (int k = 0; k < 8; ++k) {
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        Laux[4*k+i] = MAX(0, MIN(kMaxQ-1, l));
                    }
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) u |= (Laux[4*k+i] << 3*i);
                    int grid_index = kmap_q3xs[u];
                    is_on_grid_aux[k] = true;
                    if (grid_index < 0) {
                        is_on_grid_aux[k] = false;
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, this_scale, Laux + 4*k);
                    }
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*Laux[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                    scale = sumqx/sumq2; best = scale*sumqx;
                    for (int i = 0; i < 32; ++i) L[i] = Laux[i];
                    for (int k = 0; k <  8; ++k) is_on_grid[k] = is_on_grid_aux[k];
                }
            }
            int n_not_ongrid = 0;
            for (int k = 0; k < 8; ++k) if (!is_on_grid[k]) ++n_not_ongrid;
            if (n_not_ongrid > 0 && scale > 0) {
                float id = 1/scale;
                for (int k = 0; k < 8; ++k) {
                    if (is_on_grid[k]) continue;
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        l = MAX(0, MIN(kMaxQ-1, l));
                        u |= (l << 3*i);
                    }
                    int grid_index = kmap_q3xs[u];
                    if (grid_index < 0) {
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, scale, L + 4*k);
                    }
                    const int8_t * pg = (const int8_t *)(kgrid_q3xs + grid_index);
                    for (int i = 0; i < 4; ++i) L[4*k+i] = (pg[i] - 1)/2;
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*L[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0) scale = sumqx/sumq2;
            }
            if (scale < 0) {
                // This should never happen, but just in case, flip scale so that it is positive (we use uint's to encode the scale)
                // and correspondingly flip quant signs.
                scale = -scale;
                for (int k = 0; k < 4; ++k) block_signs[k] = (~block_signs[k]) & 127;
            }
            for (int k = 0; k < 8; ++k) {
                uint16_t u = 0;
                for (int i = 0; i < 4; ++i) u |= (L[4*k+i] << 3*i);
                int grid_index = kmap_q3xs[u];
                if (grid_index < 0) {
                    printf("Oops: found point %u not on grid:", u);
                    for (int i = 0; i < 4; ++i) printf(" %d", L[4*k+i]);
                    printf("\n");
                    GGML_ABORT("fatal error");
                }
                if (grid_size == 256) {
                    q3[8*ib+k] = grid_index;
                } else {
                    q3[8*ib+k] = grid_index & 255;
                    qh[ib] |= ((grid_index >> 8) << k);
                }

            }
            scales_and_signs[ib] = block_signs[0] | (block_signs[1] << 7) | (block_signs[2] << 14) | (block_signs[3] << 21);
            GGML_ASSERT(scale >= 0);
            scales[ib] = scale;
            max_scale = MAX(max_scale, scale);
        }

        if (!max_scale) {
            memset(qs, 0, quant_size);
            dh += block_size/sizeof(ggml_fp16_t);
            qs += block_size;
            continue;
        }

        float d = max_scale/31;
        dh[0] = GGML_FP32_TO_FP16(d * 1.0125f);  // small improvement via this fudge factor
        float id = 1/d;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            int l = nearest_int(0.5f*(id*scales[ib]-1));
            l = MAX(0, MIN(15, l));
            scales_and_signs[ib] |= ((uint32_t)l << 28);
        }
        memcpy(qs, q3, quant_size);

        dh += block_size/sizeof(ggml_fp16_t);
        qs += block_size;

    }
}